

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

int32 mkvmuxer::WriteUIntSize(IMkvWriter *writer,uint64 value,int32 size)

{
  ulong uVar1;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  uint64 max;
  int64 bit_1;
  uint64 bit;
  ulong in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int32 local_4;
  
  if (((in_RDI == 0) || (in_EDX < 0)) || (8 < in_EDX)) {
    local_4 = -1;
  }
  else {
    if (in_EDX < 1) {
      in_EDX = 1;
      while (uVar1 = 1L << ((char)in_EDX * '\a' & 0x3fU), uVar1 - 2 < in_RSI) {
        in_EDX = in_EDX + 1;
      }
      if (8 < in_EDX) {
        return 0;
      }
    }
    else {
      in_stack_ffffffffffffffd8 = 1L << ((char)in_EDX * '\a' & 0x3fU);
      uVar1 = in_stack_ffffffffffffffd8;
      if (in_stack_ffffffffffffffd8 - 2 < in_RSI) {
        return -1;
      }
    }
    local_4 = SerializeInt((IMkvWriter *)(uVar1 | in_RSI),CONCAT44(in_EDX,in_stack_ffffffffffffffe0)
                           ,(int32)(in_stack_ffffffffffffffd8 >> 0x20));
  }
  return local_4;
}

Assistant:

int32 WriteUIntSize(IMkvWriter* writer, uint64 value, int32 size) {
  if (!writer || size < 0 || size > 8)
    return -1;

  if (size > 0) {
    const uint64 bit = 1LL << (size * 7);

    if (value > (bit - 2))
      return -1;

    value |= bit;
  } else {
    size = 1;
    int64 bit;

    for (;;) {
      bit = 1LL << (size * 7);
      const uint64 max = bit - 2;

      if (value <= max)
        break;

      ++size;
    }

    if (size > 8)
      return false;

    value |= bit;
  }

  return SerializeInt(writer, value, size);
}